

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapidxml.hpp
# Opt level: O0

char __thiscall
rapidxml::xml_document<char>::parse_and_append_data<0>
          (xml_document<char> *this,xml_node<char> *node,char **text,char *contents_start)

{
  char cVar1;
  char *value_00;
  char *pcVar2;
  xml_node<char> *child;
  char *pcVar3;
  char ch;
  xml_node<char> *data;
  char *end;
  char *value;
  char *contents_start_local;
  char **text_local;
  xml_node<char> *node_local;
  xml_document<char> *this_local;
  
  *text = contents_start;
  value_00 = *text;
  pcVar2 = skip_and_expand_character_refs<rapidxml::xml_document<char>::text_pred,rapidxml::xml_document<char>::text_pure_no_ws_pred,0>
                     (text);
  child = memory_pool<char>::allocate_node
                    (&this->super_memory_pool<char>,node_data,(char *)0x0,(char *)0x0,0,0);
  xml_base<char>::value(&child->super_xml_base<char>,value_00,(long)pcVar2 - (long)value_00);
  xml_node<char>::append_node(node,child);
  pcVar3 = xml_base<char>::value(&node->super_xml_base<char>);
  if (*pcVar3 == '\0') {
    xml_base<char>::value(&node->super_xml_base<char>,value_00,(long)pcVar2 - (long)value_00);
  }
  cVar1 = **text;
  *pcVar2 = '\0';
  return cVar1;
}

Assistant:

Ch parse_and_append_data(xml_node<Ch> *node, Ch *&text, Ch *contents_start)
        {
            // Backup to contents start if whitespace trimming is disabled
            if (!(Flags & parse_trim_whitespace))
                text = contents_start;     
            
            // Skip until end of data
            Ch *value = text, *end;
            if (Flags & parse_normalize_whitespace)
                end = skip_and_expand_character_refs<text_pred, text_pure_with_ws_pred, Flags>(text);   
            else
                end = skip_and_expand_character_refs<text_pred, text_pure_no_ws_pred, Flags>(text);

            // Trim trailing whitespace if flag is set; leading was already trimmed by whitespace skip after >
            if (Flags & parse_trim_whitespace)
            {
                if (Flags & parse_normalize_whitespace)
                {
                    // Whitespace is already condensed to single space characters by skipping function, so just trim 1 char off the end
                    if (*(end - 1) == Ch(' '))
                        --end;
                }
                else
                {
                    // Backup until non-whitespace character is found
                    while (whitespace_pred::test(*(end - 1)))
                        --end;
                }
            }
            
            // If characters are still left between end and value (this test is only necessary if normalization is enabled)
            // Create new data node
            if (!(Flags & parse_no_data_nodes))
            {
                xml_node<Ch> *data = this->allocate_node(node_data);
                data->value(value, end - value);
                node->append_node(data);
            }

            // Add data to parent node if no data exists yet
            if (!(Flags & parse_no_element_values)) 
                if (*node->value() == Ch('\0'))
                    node->value(value, end - value);

            // Place zero terminator after value
            if (!(Flags & parse_no_string_terminators))
            {
                Ch ch = *text;
                *end = Ch('\0');
                return ch;      // Return character that ends data; this is required because zero terminator overwritten it
            }

            // Return character that ends data
            return *text;
        }